

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_objects.cpp
# Opt level: O2

void __thiscall
ear::throw_if_not_implemented::operator()(throw_if_not_implemented *this,CartesianPosition *param_1)

{
  not_implemented *this_00;
  allocator<char> local_39;
  string local_38;
  
  this_00 = (not_implemented *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"cartesian",&local_39);
  not_implemented::not_implemented(this_00,&local_38);
  __cxa_throw(this_00,&not_implemented::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void operator()(const CartesianPosition&) const {
      throw not_implemented("cartesian");
    }